

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_duckdb::vector<long,_true>_&,_const_duckdb::vector<long,_true>_&> * __thiscall
Catch::ExprLhs<duckdb::vector<long,true>const&>::operator==
          (BinaryExpr<const_duckdb::vector<long,_true>_&,_const_duckdb::vector<long,_true>_&>
           *__return_storage_ptr__,ExprLhs<duckdb::vector<long,true>const&> *this,
          vector<long,_true> *rhs)

{
  vector<long,_true> *pvVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = std::operator==(*(vector<long,_std::allocator<long>_> **)this,
                          &rhs->super_vector<long,_std::allocator<long>_>);
  pvVar1 = *(vector<long,_true> **)this;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00573aa0;
  __return_storage_ptr__->m_lhs = pvVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }